

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O2

string * __thiscall
PatternAddressMapper::get_mapping_text_repr_abi_cxx11_
          (string *__return_storage_ptr__,PatternAddressMapper *this)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  string *psVar3;
  ostream *poVar4;
  mapped_type *this_00;
  long lVar5;
  __node_base *p_Var6;
  ulong uVar7;
  undefined1 __k [8];
  stringstream local_208 [8];
  stringstream mapping_str;
  undefined1 local_1f8 [24];
  uint auStack_1e0 [88];
  string local_80;
  key_type *local_60;
  _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  string *local_50;
  undefined1 auStack_48 [8];
  vector<int,_std::allocator<int>_> keys;
  
  keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58 = (_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->aggressor_to_addr;
  p_Var6 = &(this->aggressor_to_addr)._M_h._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)auStack_48,(value_type_conflict2 *)(p_Var6 + 1))
    ;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (auStack_48,
             keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  local_50 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_208);
  local_60 = keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  uVar7 = 0;
  lVar5 = 0;
  __k = auStack_48;
  while( true ) {
    psVar3 = local_50;
    if (__k == (undefined1  [8])local_60) break;
    if ((lVar5 != 0) && (lVar5 + (uVar7 / 3) * 3 == 0)) {
      std::endl<char,std::char_traits<char>>((ostream *)local_1f8);
    }
    *(undefined8 *)(*(_func_int **)(local_1f8._0_8_ + -0x18) + (long)(local_1f8 + 0x10)) = 3;
    *(uint *)(local_1f8 + 0x18 + (long)*(_func_int **)(local_1f8._0_8_ + -0x18)) =
         *(uint *)(local_1f8 + 0x18 + (long)*(_func_int **)(local_1f8._0_8_ + -0x18)) & 0xffffff4f |
         0x20;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,*(int *)__k);
    poVar4 = std::operator<<(poVar4," -> ");
    pp_Var1 = poVar4->_vptr_basic_ostream;
    *(undefined8 *)(&poVar4->field_0x10 + (long)pp_Var1[-3]) = 0xd;
    p_Var2 = pp_Var1[-3];
    *(uint *)(&poVar4->field_0x18 + (long)p_Var2) =
         *(uint *)(&poVar4->field_0x18 + (long)p_Var2) & 0xffffff4f | 0x20;
    this_00 = std::__detail::
              _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at(local_58,(key_type *)__k);
    DRAMAddr::to_string_compact_abi_cxx11_(&local_80,this_00);
    poVar4 = std::operator<<(poVar4,(string *)&local_80);
    std::operator<<(poVar4,"   ");
    std::__cxx11::string::~string((string *)&local_80);
    uVar7 = uVar7 + 1;
    __k = (undefined1  [8])((long)__k + 4);
    lVar5 = lVar5 + -1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_208);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)auStack_48);
  return psVar3;
}

Assistant:

std::string PatternAddressMapper::get_mapping_text_repr() {
  // get all keys (this is to not assume that keys always must start by 1) and sort them
  std::vector<int> keys;
  for (auto const &map: aggressor_to_addr) keys.push_back(map.first);
  std::sort(keys.begin(), keys.end());

  // iterate over keys and build text representation
  size_t cnt = 0;
  std::stringstream mapping_str;
  for (const auto &k : keys) {
    if (cnt > 0 && cnt%3==0) mapping_str << std::endl;
    mapping_str << std::setw(3) << std::left << k
                << " -> "
                << std::setw(13) << std::left << aggressor_to_addr.at(k).to_string_compact()
                << "   ";
    cnt++;
  }

  return mapping_str.str();
}